

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPt___char_const>_kj__String_kj__ArrayPtr<char_const>_kj__CappedArray<char,14ul>_kj__ArrayPtr<char_const>>
          (StringTree *this,long pos,long branchIndex,size_t *first,undefined8 rest,
          undefined8 rest_1,undefined8 rest_2,undefined8 rest_3,undefined8 rest_4,undefined8 rest_5,
          undefined8 rest_6,undefined8 rest_7,undefined8 rest_8,undefined8 rest_9,undefined8 rest_10
          ,undefined8 rest_11,undefined8 rest_12,undefined8 rest_13,undefined8 rest_14,
          undefined8 rest_15,undefined8 rest_16,undefined8 rest_17,undefined8 rest_18,
          undefined8 rest_19,undefined8 rest_20,undefined8 rest_21,undefined8 rest_22,
          undefined8 rest_23,undefined8 rest_24,undefined8 rest_25,undefined8 rest_26,
          undefined8 rest_27,undefined8 rest_28,undefined8 rest_29,undefined8 rest_30,
          undefined8 rest_31,undefined8 rest_32,undefined8 rest_33,undefined8 rest_34,
          undefined8 rest_35,undefined8 rest_36,undefined8 rest_37,undefined8 rest_38,
          undefined8 rest_39,undefined8 rest_40,undefined8 rest_41,undefined8 rest_42,
          undefined8 rest_43,undefined8 rest_44,undefined8 rest_45,undefined8 rest_46,
          undefined8 rest_47,undefined8 rest_48,undefined8 rest_49,undefined8 rest_50,
          undefined8 rest_51,undefined8 rest_52,undefined8 rest_53,undefined8 rest_54,
          undefined8 rest_55,undefined8 rest_56,undefined8 rest_57,undefined8 rest_58,
          undefined8 rest_59,undefined8 rest_60,undefined8 rest_61,undefined8 rest_62,
          undefined8 rest_63)

{
  Branch *pBVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Branch *pBVar4;
  char *pcVar5;
  undefined8 in_stack_000001f8;
  
  pcVar5 = (char *)(this->text).content.size_;
  if (pcVar5 != (char *)0x0) {
    pcVar5 = (this->text).content.ptr;
  }
  pBVar1 = (this->branches).ptr;
  pBVar1[branchIndex].index = pos - (long)pcVar5;
  pBVar1[branchIndex].content.size_ = *first;
  pcVar5 = pBVar1[branchIndex].content.text.content.ptr;
  if (pcVar5 != (char *)0x0) {
    sVar2 = pBVar1[branchIndex].content.text.content.size_;
    pBVar1[branchIndex].content.text.content.ptr = (char *)0x0;
    pBVar1[branchIndex].content.text.content.size_ = 0;
    pAVar3 = pBVar1[branchIndex].content.text.content.disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pcVar5,1,sVar2,sVar2,0);
  }
  pBVar1[branchIndex].content.text.content.ptr = (char *)first[1];
  pBVar1[branchIndex].content.text.content.size_ = first[2];
  pBVar1[branchIndex].content.text.content.disposer = (ArrayDisposer *)first[3];
  first[1] = 0;
  first[2] = 0;
  pBVar4 = pBVar1[branchIndex].content.branches.ptr;
  if (pBVar4 != (Branch *)0x0) {
    sVar2 = pBVar1[branchIndex].content.branches.size_;
    pBVar1[branchIndex].content.branches.ptr = (Branch *)0x0;
    pBVar1[branchIndex].content.branches.size_ = 0;
    pAVar3 = pBVar1[branchIndex].content.branches.disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pBVar4,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  pBVar1[branchIndex].content.branches.ptr = (Branch *)first[4];
  pBVar1[branchIndex].content.branches.size_ = first[5];
  pBVar1[branchIndex].content.branches.disposer = (ArrayDisposer *)first[6];
  first[4] = 0;
  first[5] = 0;
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPt___char_const>_kj__String_kj__ArrayPtr<char_const>_kj__CappedArray<char,14ul>_kj__ArrayPtr<char_const>>
            (this,pos,branchIndex + 1,rest,rest_1,rest_2,rest_3,rest_4,rest_5,rest_6,rest_7,rest_8,
             rest_9,rest_10,rest_11,rest_12,rest_13,rest_14,rest_15,rest_16,rest_17,rest_18,rest_19,
             rest_20,rest_21,rest_22,rest_23,rest_24,rest_25,rest_26,rest_27,rest_28,rest_29,rest_30
             ,rest_31,rest_32,rest_33,rest_34,rest_35,rest_36,rest_37,rest_38,rest_39,rest_40,
             rest_41,rest_42,rest_43,rest_44,rest_45,rest_46,rest_47,rest_48,rest_49,rest_50,rest_51
             ,rest_52,rest_53,rest_54,rest_55,rest_56,rest_57,rest_58,rest_59,rest_60,rest_61,
             rest_62,rest_63,in_stack_000001f8);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, StringTree&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = kj::mv(first);
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}